

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

void __thiscall m6502::nmi(m6502 *this)

{
  uint8_t uVar1;
  int iVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  uint __fd;
  undefined8 in_RCX;
  size_t sVar5;
  uint16_t hi;
  uint16_t lo;
  m6502 *this_local;
  ulong __n;
  
  uVar1 = GetFlag(this,I);
  if (uVar1 == '\0') {
    iVar2 = this->stackPointer + 0x100;
    sVar5 = CONCAT62((int6)((ulong)in_RCX >> 0x10),(short)iVar2);
    write(this,iVar2,(void *)(ulong)(uint)((int)(uint)this->pc >> 8),sVar5);
    this->stackPointer = this->stackPointer + 0xff;
    iVar2 = this->stackPointer + 0x100;
    write(this,iVar2,(void *)(ulong)(byte)this->pc,CONCAT62((int6)(sVar5 >> 0x10),(short)iVar2));
    this->stackPointer = this->stackPointer + 0xff;
    SetFlag(this,B,false);
    SetFlag(this,U,true);
    SetFlag(this,I,true);
    __fd = this->stackPointer + 0x100;
    __n = (ulong)__fd;
    write(this,__fd,(void *)(ulong)this->status,__n);
    uVar1 = this->stackPointer + 0xff;
    sVar5 = CONCAT71((int7)(__n >> 8),uVar1);
    this->stackPointer = uVar1;
    this->addrAbs = 0xfffa;
    sVar3 = read(this,(uint)this->addrAbs,(void *)0x0,sVar5);
    sVar4 = read(this,(uint)(ushort)(this->addrAbs + 1),(void *)0x0,sVar5);
    this->pc = (ushort)(byte)sVar4 << 8 | (ushort)sVar3 & 0xff;
    this->cycles = '\b';
  }
  return;
}

Assistant:

void nmi()
  {
    if (GetFlag(I) == 0)
    {
      write(0x0100u + stackPointer, (pc >> 8) & 0x00FFu);
      --stackPointer;
      write(0x0100u + stackPointer, pc & 0x00FFu);
      --stackPointer;

      SetFlag(B, 0);
      SetFlag(U, 1);
      SetFlag(I, 1);
      write(0x0100 + stackPointer, status);
      --stackPointer;

      addrAbs = 0xFFFAu;
      uint16_t lo = read(addrAbs);
      uint16_t hi = read(addrAbs + 1);
      pc = (hi << 8) | lo;

      cycles = 8;
    }
  }